

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O0

void gpu_mapping_destroy(gpu_mapping *gpu_mapping)

{
  gpu_mapping *local_28;
  gpu_mapping *prev;
  gpu_mapping *it;
  gpu_object *obj;
  gpu_mapping *gpu_mapping_local;
  
  local_28 = (gpu_mapping *)0x0;
  prev = gpu_mapping->object->gpu_mappings;
  while( true ) {
    if (prev == (gpu_mapping *)0x0) {
      fprintf(_stdout,"ERROR: can\'t find gpu_mapping on object\'s gpu_mappings list%s\n","");
      if (mmt_sync_fd != -1) {
        fflush(_stdout);
      }
      demmt_abort();
    }
    if (prev == gpu_mapping) break;
    local_28 = prev;
    prev = prev->next;
  }
  if (local_28 == (gpu_mapping *)0x0) {
    gpu_mapping->object->gpu_mappings = prev->next;
  }
  else {
    local_28->next = prev->next;
  }
  prev->next = (gpu_mapping *)0x0;
  free(prev);
  return;
}

Assistant:

void gpu_mapping_destroy(struct gpu_mapping *gpu_mapping)
{
	struct gpu_object *obj = gpu_mapping->object;

	struct gpu_mapping *it, *prev = NULL;
	for (it = obj->gpu_mappings; it != NULL; prev = it, it = it->next)
		if (it == gpu_mapping)
		{
			if (prev)
				prev->next = it->next;
			else
				obj->gpu_mappings = it->next;
			it->next = NULL;
			free(it);

			return;
		}
	mmt_error("can't find gpu_mapping on object's gpu_mappings list%s\n", "");
	demmt_abort();
}